

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

char * el::base::utils::DateTime::parseFormat
                 (char *buf,size_t bufSz,char *format,tm *tInfo,size_t msec,
                 MillisecondsWidth *msWidth)

{
  char *bufLim_00;
  tm *ptVar1;
  char *local_50;
  char *bufLim;
  MillisecondsWidth *msWidth_local;
  size_t msec_local;
  tm *tInfo_local;
  char *format_local;
  size_t bufSz_local;
  char *buf_local;
  
  bufLim_00 = buf + bufSz;
  tInfo_local = (tm *)format;
  bufSz_local = (size_t)buf;
  do {
    if ((char)tInfo_local->tm_sec == '\0') {
      return (char *)bufSz_local;
    }
    if ((char)tInfo_local->tm_sec != '%') goto LAB_0014ee7c;
    ptVar1 = (tm *)((long)&tInfo_local->tm_sec + 1);
    switch(*(undefined1 *)((long)&tInfo_local->tm_sec + 1)) {
    case 0:
      goto LAB_0014ee7c;
    default:
      tInfo_local = ptVar1;
      break;
    case 0x25:
      tInfo_local = ptVar1;
LAB_0014ee7c:
      if ((char *)bufSz_local == bufLim_00) {
        return (char *)bufSz_local;
      }
      *(char *)bufSz_local = (char)tInfo_local->tm_sec;
      bufSz_local = bufSz_local + 1;
      break;
    case 0x41:
      bufSz_local = (size_t)Str::addToBuff(*(char **)(consts::kDays + (long)tInfo->tm_wday * 8),
                                           (char *)bufSz_local,bufLim_00);
      tInfo_local = ptVar1;
      break;
    case 0x42:
      bufSz_local = (size_t)Str::addToBuff(*(char **)(consts::kMonths + (long)tInfo->tm_mon * 8),
                                           (char *)bufSz_local,bufLim_00);
      tInfo_local = ptVar1;
      break;
    case 0x46:
      if (tInfo->tm_hour < 0xc) {
        local_50 = consts::kAm;
      }
      else {
        local_50 = consts::kPm;
      }
      bufSz_local = (size_t)Str::addToBuff(local_50,(char *)bufSz_local,bufLim_00);
      tInfo_local = ptVar1;
      break;
    case 0x48:
      bufSz_local = (size_t)Str::convertAndAddToBuff
                                      ((long)tInfo->tm_hour,2,(char *)bufSz_local,bufLim_00,true);
      tInfo_local = ptVar1;
      break;
    case 0x4d:
      bufSz_local = (size_t)Str::convertAndAddToBuff
                                      ((long)(tInfo->tm_mon + 1),2,(char *)bufSz_local,bufLim_00,
                                       true);
      tInfo_local = ptVar1;
      break;
    case 0x59:
      bufSz_local = (size_t)Str::convertAndAddToBuff
                                      ((long)(tInfo->tm_year + 0x76c),4,(char *)bufSz_local,
                                       bufLim_00,true);
      tInfo_local = ptVar1;
      break;
    case 0x61:
      bufSz_local = (size_t)Str::addToBuff(*(char **)(consts::kDaysAbbrev + (long)tInfo->tm_wday * 8
                                                     ),(char *)bufSz_local,bufLim_00);
      tInfo_local = ptVar1;
      break;
    case 0x62:
      bufSz_local = (size_t)Str::addToBuff(*(char **)(consts::kMonthsAbbrev +
                                                     (long)tInfo->tm_mon * 8),(char *)bufSz_local,
                                           bufLim_00);
      tInfo_local = ptVar1;
      break;
    case 100:
      bufSz_local = (size_t)Str::convertAndAddToBuff
                                      ((long)tInfo->tm_mday,2,(char *)bufSz_local,bufLim_00,true);
      tInfo_local = ptVar1;
      break;
    case 0x67:
    case 0x7a:
      bufSz_local = (size_t)Str::convertAndAddToBuff
                                      (msec,msWidth->m_width,(char *)bufSz_local,bufLim_00,true);
      tInfo_local = ptVar1;
      break;
    case 0x68:
      bufSz_local = (size_t)Str::convertAndAddToBuff
                                      ((long)(tInfo->tm_hour % 0xc),2,(char *)bufSz_local,bufLim_00,
                                       true);
      tInfo_local = ptVar1;
      break;
    case 0x6d:
      bufSz_local = (size_t)Str::convertAndAddToBuff
                                      ((long)tInfo->tm_min,2,(char *)bufSz_local,bufLim_00,true);
      tInfo_local = ptVar1;
      break;
    case 0x73:
      bufSz_local = (size_t)Str::convertAndAddToBuff
                                      ((long)tInfo->tm_sec,2,(char *)bufSz_local,bufLim_00,true);
      tInfo_local = ptVar1;
      break;
    case 0x79:
      bufSz_local = (size_t)Str::convertAndAddToBuff
                                      ((long)(tInfo->tm_year + 0x76c),2,(char *)bufSz_local,
                                       bufLim_00,true);
      tInfo_local = ptVar1;
    }
    tInfo_local = (tm *)((long)&tInfo_local->tm_sec + 1);
  } while( true );
}

Assistant:

static char* parseFormat(char* buf, std::size_t bufSz, const char* format, const struct tm* tInfo,
            std::size_t msec, const base::MillisecondsWidth* msWidth) {
        const char* bufLim = buf + bufSz;
        for (; *format; ++format) {
            if (*format == base::consts::kFormatSpecifierChar) {
                switch (*++format) {
                case base::consts::kFormatSpecifierChar:  // Escape
                    break;
                case '\0':  // End
                    --format;
                    break;
                case 'd':  // Day
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_mday, 2, buf, bufLim);
                    continue;
                case 'a':  // Day of week (short)
                    buf = base::utils::Str::addToBuff(base::consts::kDaysAbbrev[tInfo->tm_wday], buf, bufLim);
                    continue;
                case 'A':  // Day of week (long)
                    buf = base::utils::Str::addToBuff(base::consts::kDays[tInfo->tm_wday], buf, bufLim);
                    continue;
                case 'M':  // month
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_mon + 1, 2, buf, bufLim);
                    continue;
                case 'b':  // month (short)
                    buf = base::utils::Str::addToBuff(base::consts::kMonthsAbbrev[tInfo->tm_mon], buf, bufLim);
                    continue;
                case 'B':  // month (long)
                    buf = base::utils::Str::addToBuff(base::consts::kMonths[tInfo->tm_mon], buf, bufLim);
                    continue;
                case 'y':  // year (two digits)
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_year + base::consts::kYearBase, 2, buf, bufLim);
                    continue;
                case 'Y':  // year (four digits)
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_year + base::consts::kYearBase, 4, buf, bufLim);
                    continue;
                case 'h':  // hour (12-hour)
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_hour % 12, 2, buf, bufLim);
                    continue;
                case 'H':  // hour (24-hour)
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_hour, 2, buf, bufLim);
                    continue;
                case 'm':  // minute
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_min, 2, buf, bufLim);
                    continue;
                case 's':  // second
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_sec, 2, buf, bufLim);
                    continue;
                case 'z':  // milliseconds
                case 'g':
                    buf = base::utils::Str::convertAndAddToBuff(msec, msWidth->m_width, buf, bufLim);
                    continue;
                case 'F':  // AM/PM
                    buf = base::utils::Str::addToBuff((tInfo->tm_hour >= 12) ? base::consts::kPm : base::consts::kAm, buf, bufLim);
                    continue;
                default:
                    continue;
                }
            }
            if (buf == bufLim) break;
            *buf++ = *format;
        }
        return buf;
    }